

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils.cpp
# Opt level: O0

bool YAML::Utils::WriteTagWithPrefix(ostream_wrapper *out,string *prefix,string *tag)

{
  bool bVar1;
  char *str;
  size_t sVar2;
  StringCharSource *source;
  ostream_wrapper *in_RDI;
  int n_1;
  StringCharSource tagBuffer;
  int n;
  StringCharSource prefixBuffer;
  undefined7 in_stack_ffffffffffffff78;
  char in_stack_ffffffffffffff7f;
  ostream_wrapper *in_stack_ffffffffffffff80;
  ostream_wrapper *stream;
  StringCharSource *in_stack_ffffffffffffff88;
  ostream_wrapper *in_stack_ffffffffffffff90;
  int local_5c;
  StringCharSource local_58;
  int local_3c;
  StringCharSource local_38;
  ostream_wrapper *local_10;
  
  local_10 = in_RDI;
  YAML::operator<<(in_stack_ffffffffffffff80,
                   (char (*) [2])CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  str = (char *)std::__cxx11::string::c_str();
  sVar2 = std::__cxx11::string::size();
  StringCharSource::StringCharSource(&local_38,str,sVar2);
  while (bVar1 = StringCharSource::operator_cast_to_bool(&local_38), bVar1) {
    Exp::URI();
    local_3c = RegEx::Match<YAML::StringCharSource>
                         ((RegEx *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (local_3c < 1) {
      return false;
    }
    while (local_3c = local_3c + -1, -1 < local_3c) {
      in_stack_ffffffffffffff90 = local_10;
      StringCharSource::operator[](&local_38,0);
      YAML::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
      StringCharSource::operator++(&local_38);
    }
  }
  YAML::operator<<(in_stack_ffffffffffffff80,
                   (char (*) [2])CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  source = (StringCharSource *)std::__cxx11::string::c_str();
  sVar2 = std::__cxx11::string::size();
  StringCharSource::StringCharSource(&local_58,(char *)source,sVar2);
  while( true ) {
    bVar1 = StringCharSource::operator_cast_to_bool(&local_58);
    if (!bVar1) {
      return true;
    }
    Exp::Tag();
    local_5c = RegEx::Match<YAML::StringCharSource>((RegEx *)in_stack_ffffffffffffff90,source);
    if (local_5c < 1) break;
    while (local_5c = local_5c + -1, -1 < local_5c) {
      stream = local_10;
      StringCharSource::operator[](&local_58,0);
      YAML::operator<<(stream,in_stack_ffffffffffffff7f);
      StringCharSource::operator++(&local_58);
    }
  }
  return false;
}

Assistant:

bool WriteTagWithPrefix(ostream_wrapper& out, const std::string& prefix,
                        const std::string& tag) {
  out << "!";
  StringCharSource prefixBuffer(prefix.c_str(), prefix.size());
  while (prefixBuffer) {
    int n = Exp::URI().Match(prefixBuffer);
    if (n <= 0) {
      return false;
    }

    while (--n >= 0) {
      out << prefixBuffer[0];
      ++prefixBuffer;
    }
  }

  out << "!";
  StringCharSource tagBuffer(tag.c_str(), tag.size());
  while (tagBuffer) {
    int n = Exp::Tag().Match(tagBuffer);
    if (n <= 0) {
      return false;
    }

    while (--n >= 0) {
      out << tagBuffer[0];
      ++tagBuffer;
    }
  }
  return true;
}